

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

Operation * __thiscall dxil_spv::SPIRVModule::allocate_op(SPIRVModule *this,Op op,Id id,Id type_id)

{
  Operation *pOVar1;
  
  pOVar1 = ScratchPool<dxil_spv::Operation>::allocate_raw
                     (&((this->impl)._M_t.
                        super___uniq_ptr_impl<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_dxil_spv::SPIRVModule::Impl_*,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
                        .super__Head_base<0UL,_dxil_spv::SPIRVModule::Impl_*,_false>._M_head_impl)->
                       operation_pool);
  pOVar1->op = op;
  pOVar1->id = id;
  pOVar1->type_id = type_id;
  pOVar1->num_arguments = 0;
  pOVar1->literal_mask = '\0';
  pOVar1->flags = '\0';
  return pOVar1;
}

Assistant:

Operation *SPIRVModule::allocate_op(spv::Op op, spv::Id id, spv::Id type_id)
{
	return impl->operation_pool.allocate(op, id, type_id);
}